

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# X3DExporter.cpp
# Opt level: O1

bool __thiscall
Assimp::X3DExporter::CheckAndExport_Light(X3DExporter *this,aiNode *pNode,size_t pTabLevel)

{
  char *__s;
  pointer pcVar1;
  float fVar2;
  float fVar3;
  uint uVar4;
  uint uVar5;
  aiLightSourceType aVar6;
  aiLight *paVar7;
  size_t pTabLevel_00;
  int iVar8;
  aiMatrix4x4t<float> *paVar9;
  _Node *p_Var10;
  runtime_error *this_00;
  bool bVar11;
  aiLight **ppaVar12;
  X3DExporter *pXVar13;
  float fVar14;
  list<Assimp::X3DExporter::SAttribute,_std::allocator<Assimp::X3DExporter::SAttribute>_> attr_list;
  anon_class_16_2_65aab299 Vec3ToAttrList;
  aiVector3D attenuation;
  undefined1 local_160 [32];
  _Alloc_hider local_140;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_130;
  float local_11c;
  float local_118;
  float local_114;
  float local_110;
  float local_10c;
  float local_108;
  float local_104;
  aiNode *local_100;
  aiVector3D local_f8;
  _List_base<Assimp::X3DExporter::SAttribute,_std::allocator<Assimp::X3DExporter::SAttribute>_>
  local_e8;
  X3DExporter *local_d0;
  anon_class_16_2_65aab299 local_c8;
  undefined1 local_b8 [8];
  ai_real local_b0;
  aiVector3D local_98;
  undefined1 local_88 [16];
  undefined1 local_78 [16];
  undefined1 local_68 [16];
  undefined1 local_58 [16];
  size_t local_48;
  aiVector3D local_3c;
  
  local_e8._M_impl._M_node.super__List_node_base._M_next = (_List_node_base *)&local_e8;
  local_e8._M_impl._M_node._M_size = 0;
  uVar4 = (pNode->mName).length;
  local_e8._M_impl._M_node.super__List_node_base._M_prev =
       local_e8._M_impl._M_node.super__List_node_base._M_next;
  local_c8.this = this;
  local_c8.attr_list =
       (list<Assimp::X3DExporter::SAttribute,_std::allocator<Assimp::X3DExporter::SAttribute>_> *)
       local_e8._M_impl._M_node.super__List_node_base._M_next;
  if ((ulong)uVar4 != 0) {
    uVar5 = this->mScene->mNumLights;
    if (uVar5 != 0) {
      ppaVar12 = this->mScene->mLights;
      local_100 = pNode;
      local_d0 = this;
      local_48 = pTabLevel;
      do {
        paVar7 = *ppaVar12;
        if (uVar4 == (paVar7->mName).length) {
          __s = (paVar7->mName).data;
          pXVar13 = (X3DExporter *)__s;
          iVar8 = bcmp((pNode->mName).data,__s,(ulong)uVar4);
          if (iVar8 == 0) {
            Matrix_GlobalToCurrent((aiMatrix4x4 *)local_160,pXVar13,local_100);
            paVar9 = aiMatrix4x4t<float>::Inverse((aiMatrix4x4t<float> *)local_160);
            local_118 = paVar9->a1;
            local_11c = paVar9->a2;
            local_88 = ZEXT416((uint)paVar9->a3);
            local_58 = ZEXT416((uint)paVar9->a4);
            local_110 = paVar9->b1;
            local_114 = paVar9->b2;
            local_78 = ZEXT416((uint)paVar9->b3);
            local_68 = ZEXT416((uint)paVar9->b4);
            local_108 = paVar9->c1;
            local_10c = paVar9->c2;
            local_104 = paVar9->c3;
            local_100 = (aiNode *)CONCAT44(local_100._4_4_,paVar9->c4);
            pcVar1 = local_160 + 0x10;
            local_160._0_8_ = pcVar1;
            std::__cxx11::string::_M_construct<char_const*>((string *)local_160,"DEF","");
            pTabLevel_00 = local_48;
            std::__cxx11::string::string<std::allocator<char>>
                      ((string *)&local_140,__s,(allocator<char> *)local_b8);
            p_Var10 = std::__cxx11::
                      list<Assimp::X3DExporter::SAttribute,_std::allocator<Assimp::X3DExporter::SAttribute>_>
                      ::_M_create_node<Assimp::X3DExporter::SAttribute>
                                ((list<Assimp::X3DExporter::SAttribute,_std::allocator<Assimp::X3DExporter::SAttribute>_>
                                  *)&local_e8,(SAttribute *)local_160);
            std::__detail::_List_node_base::_M_hook(&p_Var10->super__List_node_base);
            local_e8._M_impl._M_node._M_size = local_e8._M_impl._M_node._M_size + 1;
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_140._M_p != &local_130) {
              operator_delete(local_140._M_p,local_130._M_allocated_capacity + 1);
            }
            if ((pointer)local_160._0_8_ != pcVar1) {
              operator_delete((void *)local_160._0_8_,local_160._16_8_ + 1);
            }
            local_160._0_8_ = pcVar1;
            std::__cxx11::string::_M_construct<char_const*>((string *)local_160,"global","");
            local_140._M_p = (pointer)&local_130;
            std::__cxx11::string::_M_construct<char_const*>((string *)&local_140,"true","");
            p_Var10 = std::__cxx11::
                      list<Assimp::X3DExporter::SAttribute,_std::allocator<Assimp::X3DExporter::SAttribute>_>
                      ::_M_create_node<Assimp::X3DExporter::SAttribute>
                                ((list<Assimp::X3DExporter::SAttribute,_std::allocator<Assimp::X3DExporter::SAttribute>_>
                                  *)&local_e8,(SAttribute *)local_160);
            std::__detail::_List_node_base::_M_hook(&p_Var10->super__List_node_base);
            local_e8._M_impl._M_node._M_size = local_e8._M_impl._M_node._M_size + 1;
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_140._M_p != &local_130) {
              operator_delete(local_140._M_p,local_130._M_allocated_capacity + 1);
            }
            if ((pointer)local_160._0_8_ != pcVar1) {
              operator_delete((void *)local_160._0_8_,local_160._16_8_ + 1);
            }
            pXVar13 = (X3DExporter *)local_160;
            local_160._0_8_ = pcVar1;
            std::__cxx11::string::_M_construct<char_const*>((string *)pXVar13,"ambientIntensity","")
            ;
            fVar14 = (paVar7->mColorAmbient).r;
            fVar2 = (paVar7->mColorAmbient).g;
            fVar3 = (paVar7->mColorAmbient).b;
            fVar14 = fVar3 * fVar3 + fVar14 * fVar14 + fVar2 * fVar2;
            if (fVar14 < 0.0) {
              fVar14 = sqrtf(fVar14);
            }
            else {
              fVar14 = SQRT(fVar14);
            }
            AttrHelper_FloatToAttrList
                      (pXVar13,(list<Assimp::X3DExporter::SAttribute,_std::allocator<Assimp::X3DExporter::SAttribute>_>
                                *)&local_e8,(string *)local_160,fVar14,0.0);
            if ((pointer)local_160._0_8_ != pcVar1) {
              operator_delete((void *)local_160._0_8_,local_160._16_8_ + 1);
            }
            pXVar13 = (X3DExporter *)local_160;
            local_160._0_8_ = pcVar1;
            std::__cxx11::string::_M_construct<char_const*>((string *)pXVar13,"color","");
            local_b8 = (undefined1  [8])0x3f8000003f800000;
            local_b0 = 1.0;
            AttrHelper_Color3ToAttrList
                      (pXVar13,(list<Assimp::X3DExporter::SAttribute,_std::allocator<Assimp::X3DExporter::SAttribute>_>
                                *)&local_e8,(string *)local_160,&paVar7->mColorDiffuse,
                       (aiColor3D *)local_b8);
            if ((pointer)local_160._0_8_ != pcVar1) {
              operator_delete((void *)local_160._0_8_,local_160._16_8_ + 1);
            }
            aVar6 = paVar7->mType;
            if (aVar6 == aiLightSource_DIRECTIONAL) {
              fVar14 = (paVar7->mDirection).x;
              fVar2 = (paVar7->mDirection).y;
              fVar3 = (paVar7->mDirection).z;
              local_b0 = local_100._0_4_ +
                         local_104 * fVar3 + local_108 * fVar14 + local_10c * fVar2;
              local_b8 = (undefined1  [8])
                         CONCAT44((float)local_68._0_4_ +
                                  (float)local_78._0_4_ * fVar3 +
                                  local_110 * fVar14 + local_114 * fVar2,
                                  (float)local_58._0_4_ +
                                  (float)local_88._0_4_ * fVar3 +
                                  local_118 * fVar14 + local_11c * fVar2);
              local_160._0_8_ = pcVar1;
              std::__cxx11::string::_M_construct<char_const*>((string *)local_160,"direction","");
              local_f8.x = 0.0;
              local_f8.y = 0.0;
              local_f8.z = -1.0;
              CheckAndExport_Light::anon_class_16_2_65aab299::operator()
                        (&local_c8,(string *)local_160,(aiVector3D *)local_b8,&local_f8);
              if ((pointer)local_160._0_8_ != pcVar1) {
                operator_delete((void *)local_160._0_8_,local_160._16_8_ + 1);
              }
              local_160._0_8_ = pcVar1;
              std::__cxx11::string::_M_construct<char_const*>
                        ((string *)local_160,"DirectionalLight","");
              NodeHelper_OpenNode(local_d0,(string *)local_160,pTabLevel_00,true,
                                  (list<Assimp::X3DExporter::SAttribute,_std::allocator<Assimp::X3DExporter::SAttribute>_>
                                   *)&local_e8);
            }
            else if (aVar6 == aiLightSource_POINT) {
              local_b8 = *(undefined1 (*) [8])&paVar7->mAttenuationConstant;
              local_b0 = paVar7->mAttenuationQuadratic;
              fVar14 = (paVar7->mPosition).x;
              fVar2 = (paVar7->mPosition).y;
              fVar3 = (paVar7->mPosition).z;
              local_f8.z = local_100._0_4_ +
                           local_104 * fVar3 + local_108 * fVar14 + local_10c * fVar2;
              local_f8._0_8_ =
                   CONCAT44((float)local_68._0_4_ +
                            (float)local_78._0_4_ * fVar3 + local_110 * fVar14 + local_114 * fVar2,
                            (float)local_58._0_4_ +
                            (float)local_88._0_4_ * fVar3 + local_118 * fVar14 + local_11c * fVar2);
              local_160._0_8_ = pcVar1;
              std::__cxx11::string::_M_construct<char_const*>((string *)local_160,"attenuation","");
              local_98.x = 1.0;
              local_98.y = 0.0;
              local_98.z = 0.0;
              CheckAndExport_Light::anon_class_16_2_65aab299::operator()
                        (&local_c8,(string *)local_160,(aiVector3D *)local_b8,&local_98);
              if ((pointer)local_160._0_8_ != pcVar1) {
                operator_delete((void *)local_160._0_8_,local_160._16_8_ + 1);
              }
              local_160._0_8_ = pcVar1;
              std::__cxx11::string::_M_construct<char_const*>((string *)local_160,"location","");
              local_98.x = 0.0;
              local_98.y = 0.0;
              local_98.z = 0.0;
              CheckAndExport_Light::anon_class_16_2_65aab299::operator()
                        (&local_c8,(string *)local_160,&local_f8,&local_98);
              if ((pointer)local_160._0_8_ != pcVar1) {
                operator_delete((void *)local_160._0_8_,local_160._16_8_ + 1);
              }
              local_160._0_8_ = pcVar1;
              std::__cxx11::string::_M_construct<char_const*>((string *)local_160,"PointLight","");
              NodeHelper_OpenNode(local_d0,(string *)local_160,pTabLevel_00,true,
                                  (list<Assimp::X3DExporter::SAttribute,_std::allocator<Assimp::X3DExporter::SAttribute>_>
                                   *)&local_e8);
            }
            else {
              if (aVar6 != aiLightSource_SPOT) {
                this_00 = (runtime_error *)__cxa_allocate_exception(0x10);
                to_string<aiLightSourceType>((string *)local_b8,paVar7->mType);
                std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                               local_160,"Unknown light type: ",
                               (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                               local_b8);
                std::runtime_error::runtime_error(this_00,(string *)local_160);
                *(undefined ***)this_00 = &PTR__runtime_error_0082bce0;
                __cxa_throw(this_00,&DeadlyImportError::typeinfo,std::runtime_error::~runtime_error)
                ;
              }
              local_b8 = *(undefined1 (*) [8])&paVar7->mAttenuationConstant;
              local_b0 = paVar7->mAttenuationQuadratic;
              fVar14 = (paVar7->mPosition).x;
              fVar2 = (paVar7->mPosition).y;
              fVar3 = (paVar7->mPosition).z;
              local_f8.z = fVar3 * local_104 + fVar14 * local_108 + fVar2 * local_10c +
                           local_100._0_4_;
              local_f8._0_8_ =
                   CONCAT44((float)local_78._0_4_ * fVar3 + local_110 * fVar14 + local_114 * fVar2 +
                            (float)local_68._0_4_,
                            (float)local_88._0_4_ * fVar3 + local_118 * fVar14 + local_11c * fVar2 +
                            (float)local_58._0_4_);
              fVar14 = (paVar7->mDirection).x;
              fVar2 = (paVar7->mDirection).y;
              fVar3 = (paVar7->mDirection).z;
              local_98.z = local_104 * fVar3 + local_108 * fVar14 + local_10c * fVar2 +
                           local_100._0_4_;
              local_98.y = (float)local_78._0_4_ * fVar3 + local_110 * fVar14 + local_114 * fVar2 +
                           (float)local_68._0_4_;
              local_98.x = (float)local_88._0_4_ * fVar3 + local_118 * fVar14 + local_11c * fVar2 +
                           (float)local_58._0_4_;
              local_160._0_8_ = pcVar1;
              std::__cxx11::string::_M_construct<char_const*>((string *)local_160,"attenuation","");
              local_3c.x = 1.0;
              local_3c.y = 0.0;
              local_3c.z = 0.0;
              CheckAndExport_Light::anon_class_16_2_65aab299::operator()
                        (&local_c8,(string *)local_160,(aiVector3D *)local_b8,&local_3c);
              if ((pointer)local_160._0_8_ != pcVar1) {
                operator_delete((void *)local_160._0_8_,local_160._16_8_ + 1);
              }
              local_160._0_8_ = pcVar1;
              std::__cxx11::string::_M_construct<char_const*>((string *)local_160,"location","");
              local_3c.x = 0.0;
              local_3c.y = 0.0;
              local_3c.z = 0.0;
              CheckAndExport_Light::anon_class_16_2_65aab299::operator()
                        (&local_c8,(string *)local_160,&local_f8,&local_3c);
              if ((pointer)local_160._0_8_ != pcVar1) {
                operator_delete((void *)local_160._0_8_,local_160._16_8_ + 1);
              }
              local_160._0_8_ = pcVar1;
              std::__cxx11::string::_M_construct<char_const*>((string *)local_160,"direction","");
              local_3c.x = 0.0;
              local_3c.y = 0.0;
              local_3c.z = -1.0;
              CheckAndExport_Light::anon_class_16_2_65aab299::operator()
                        (&local_c8,(string *)local_160,&local_98,&local_3c);
              if ((pointer)local_160._0_8_ != pcVar1) {
                operator_delete((void *)local_160._0_8_,local_160._16_8_ + 1);
              }
              pXVar13 = (X3DExporter *)local_160;
              local_160._0_8_ = pcVar1;
              std::__cxx11::string::_M_construct<char_const*>((string *)pXVar13,"beamWidth","");
              AttrHelper_FloatToAttrList
                        (pXVar13,(list<Assimp::X3DExporter::SAttribute,_std::allocator<Assimp::X3DExporter::SAttribute>_>
                                  *)&local_e8,(string *)local_160,paVar7->mAngleInnerCone,0.7854);
              if ((pointer)local_160._0_8_ != pcVar1) {
                operator_delete((void *)local_160._0_8_,local_160._16_8_ + 1);
              }
              pXVar13 = (X3DExporter *)local_160;
              local_160._0_8_ = pcVar1;
              std::__cxx11::string::_M_construct<char_const*>((string *)pXVar13,"cutOffAngle","");
              AttrHelper_FloatToAttrList
                        (pXVar13,(list<Assimp::X3DExporter::SAttribute,_std::allocator<Assimp::X3DExporter::SAttribute>_>
                                  *)&local_e8,(string *)local_160,paVar7->mAngleOuterCone,1.570796);
              if ((pointer)local_160._0_8_ != pcVar1) {
                operator_delete((void *)local_160._0_8_,local_160._16_8_ + 1);
              }
              local_160._0_8_ = pcVar1;
              std::__cxx11::string::_M_construct<char_const*>((string *)local_160,"SpotLight","");
              NodeHelper_OpenNode(local_d0,(string *)local_160,pTabLevel_00,true,
                                  (list<Assimp::X3DExporter::SAttribute,_std::allocator<Assimp::X3DExporter::SAttribute>_>
                                   *)&local_e8);
            }
            if ((pointer)local_160._0_8_ != pcVar1) {
              operator_delete((void *)local_160._0_8_,local_160._16_8_ + 1);
            }
            bVar11 = true;
            goto LAB_003658a4;
          }
        }
        ppaVar12 = ppaVar12 + 1;
      } while (uVar5 != 0);
    }
  }
  bVar11 = false;
LAB_003658a4:
  std::__cxx11::
  _List_base<Assimp::X3DExporter::SAttribute,_std::allocator<Assimp::X3DExporter::SAttribute>_>::
  _M_clear(&local_e8);
  return bVar11;
}

Assistant:

bool X3DExporter::CheckAndExport_Light(const aiNode& pNode, const size_t pTabLevel)
{
list<SAttribute> attr_list;

auto Vec3ToAttrList = [&](const string& pAttrName, const aiVector3D& pAttrValue, const aiVector3D& pAttrDefaultValue)
{
	string tstr;

	if(pAttrValue != pAttrDefaultValue)
	{
		AttrHelper_Vec3DArrToString(&pAttrValue, 1, tstr);
		attr_list.push_back({pAttrName, tstr});
	}
};

size_t idx_light;
bool found = false;

	// Name of the light source can not be empty.
	if(pNode.mName.length == 0) return false;

	// search for light with name like node has.
	for(idx_light = 0; mScene->mNumLights; idx_light++)
	{
		if(pNode.mName == mScene->mLights[idx_light]->mName)
		{
			found = true;
			break;
		}
	}

	if(!found) return false;

	// Light source is found.
	const aiLight& light = *mScene->mLights[idx_light];// Alias for conveniance.

	aiMatrix4x4 trafo_mat = Matrix_GlobalToCurrent(pNode).Inverse();

	attr_list.push_back({"DEF", light.mName.C_Str()});
	attr_list.push_back({"global", "true"});// "false" is not supported.
	// ambientIntensity="0" SFFloat [inputOutput]
	AttrHelper_FloatToAttrList(attr_list, "ambientIntensity", aiVector3D(light.mColorAmbient.r, light.mColorAmbient.g, light.mColorAmbient.b).Length(), 0);
	// color="1 1 1"        SFColor [inputOutput]
	AttrHelper_Color3ToAttrList(attr_list, "color", light.mColorDiffuse, aiColor3D(1, 1, 1));

	switch(light.mType)
	{
		case aiLightSource_DIRECTIONAL:
			{
				aiVector3D direction = trafo_mat * light.mDirection;

				Vec3ToAttrList("direction", direction, aiVector3D(0, 0, -1));
				NodeHelper_OpenNode("DirectionalLight", pTabLevel, true, attr_list);
			}

			break;
		case aiLightSource_POINT:
			{
				aiVector3D attenuation(light.mAttenuationConstant, light.mAttenuationLinear, light.mAttenuationQuadratic);
				aiVector3D location = trafo_mat * light.mPosition;

				Vec3ToAttrList("attenuation", attenuation, aiVector3D(1, 0, 0));
				Vec3ToAttrList("location", location, aiVector3D(0, 0, 0));
				NodeHelper_OpenNode("PointLight", pTabLevel, true, attr_list);
			}

			break;
		case aiLightSource_SPOT:
			{
				aiVector3D attenuation(light.mAttenuationConstant, light.mAttenuationLinear, light.mAttenuationQuadratic);
				aiVector3D location = trafo_mat * light.mPosition;
				aiVector3D direction = trafo_mat * light.mDirection;

				Vec3ToAttrList("attenuation", attenuation, aiVector3D(1, 0, 0));
				Vec3ToAttrList("location", location, aiVector3D(0, 0, 0));
				Vec3ToAttrList("direction", direction, aiVector3D(0, 0, -1));
				AttrHelper_FloatToAttrList(attr_list, "beamWidth", light.mAngleInnerCone, 0.7854f);
				AttrHelper_FloatToAttrList(attr_list, "cutOffAngle", light.mAngleOuterCone, 1.570796f);
				NodeHelper_OpenNode("SpotLight", pTabLevel, true, attr_list);
			}

			break;
		default:
			throw DeadlyExportError("Unknown light type: " + to_string(light.mType));
	}// switch(light.mType)

	return true;
}